

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr * pcacheMergeDirtyList(PgHdr *pA,PgHdr *pB)

{
  PgHdr *pPVar1;
  PgHdr result;
  
  pPVar1 = &result;
  while ((pA != (PgHdr *)0x0 && (pB != (PgHdr *)0x0))) {
    if (pA->pgno < pB->pgno) {
      pPVar1->pDirty = pA;
      pPVar1 = pA;
      pA = pA->pDirty;
    }
    else {
      pPVar1->pDirty = pB;
      pPVar1 = pB;
      pB = pB->pDirty;
    }
  }
  if (pA != (PgHdr *)0x0) {
    pB = pA;
  }
  pPVar1->pDirty = pB;
  return result.pDirty;
}

Assistant:

static PgHdr *pcacheMergeDirtyList(PgHdr *pA, PgHdr *pB){
  PgHdr result, *pTail;
  pTail = &result;
  while( pA && pB ){
    if( pA->pgno<pB->pgno ){
      pTail->pDirty = pA;
      pTail = pA;
      pA = pA->pDirty;
    }else{
      pTail->pDirty = pB;
      pTail = pB;
      pB = pB->pDirty;
    }
  }
  if( pA ){
    pTail->pDirty = pA;
  }else if( pB ){
    pTail->pDirty = pB;
  }else{
    pTail->pDirty = 0;
  }
  return result.pDirty;
}